

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_965631::RSATest_CheckFIPS_Test::TestBody(RSATest_CheckFIPS_Test *this)

{
  int iVar1;
  char *in_R9;
  pointer *__ptr;
  UniquePtr<RSA> pub;
  UniquePtr<RSA> rsa;
  AssertHelper local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  string local_38;
  unique_ptr<rsa_st,_bssl::internal::Deleter> local_18;
  
  local_18._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_rsa_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<rsa_st,_bssl::internal::Deleter,_true,_true>)
                 RSA_private_key_from_bytes((uint8_t *)&(anonymous_namespace)::kKey1,0x260);
  local_58[0] = (internal)
                ((tuple<rsa_st_*,_bssl::internal::Deleter>)
                 local_18._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl !=
                (_Head_base<0UL,_rsa_st_*,_false>)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<rsa_st_*,_bssl::internal::Deleter>)
      local_18._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl == (_Head_base<0UL,_rsa_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)0x5a8385,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x229,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((RSA *)local_48._M_head_impl != (RSA *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
    goto LAB_0035661c;
  }
  iVar1 = RSA_check_fips((RSA *)local_18._M_t.super___uniq_ptr_impl<rsa_st,_bssl::internal::Deleter>
                                ._M_t.super__Tuple_impl<0UL,_rsa_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_rsa_st_*,_false>._M_head_impl);
  local_58[0] = (internal)(iVar1 != 0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_58[0]) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)"RSA_check_fips(rsa.get())","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x22a,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((RSA *)local_48._M_head_impl != (RSA *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       RSA_public_key_from_bytes((anonymous_namespace)::kKey1Public,0x8c);
  local_58[0] = (internal)((RSA *)local_48._M_head_impl != (RSA *)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((RSA *)local_48._M_head_impl == (RSA *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)"pub","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
               ,0x22f,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
LAB_003565cb:
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if (local_60.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_60.data_ + 8))();
    }
    if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_50,local_50);
    }
  }
  else {
    iVar1 = RSA_check_fips((RSA *)local_48._M_head_impl);
    local_58[0] = (internal)(iVar1 != 0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!(bool)local_58[0]) {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_38,local_58,(AssertionResult *)"RSA_check_fips(pub.get())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_test.cc"
                 ,0x230,local_38._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
      goto LAB_003565cb;
    }
  }
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<rsa_st,_bssl::internal::Deleter> *)&local_48);
LAB_0035661c:
  std::unique_ptr<rsa_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST(RSATest, CheckFIPS) {
  bssl::UniquePtr<RSA> rsa(RSA_private_key_from_bytes(kKey1, sizeof(kKey1)));
  ASSERT_TRUE(rsa);
  EXPECT_TRUE(RSA_check_fips(rsa.get()));

  // Check that RSA_check_fips works on a public key.
  bssl::UniquePtr<RSA> pub(
      RSA_public_key_from_bytes(kKey1Public, sizeof(kKey1Public)));
  ASSERT_TRUE(pub);
  EXPECT_TRUE(RSA_check_fips(pub.get()));
}